

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

int match(char **sp,char *t)

{
  char cVar1;
  char *local_30;
  char *s;
  int d;
  int c;
  char *t_local;
  char **sp_local;
  
  local_30 = *sp;
  _d = t;
  do {
    cVar1 = *_d;
    if (cVar1 == 0) {
      *sp = local_30 + 1;
      return 1;
    }
    s._4_4_ = (int)local_30[1];
    if ((0x40 < s._4_4_) && (s._4_4_ < 0x5b)) {
      s._4_4_ = s._4_4_ + 0x20;
    }
    local_30 = local_30 + 1;
    _d = _d + 1;
  } while (s._4_4_ == cVar1);
  return 0;
}

Assistant:

static int
match(const char **sp, const char *t)
{
	int c, d;
	const char *s = *sp;

	while((d = *t++)) {
		if ((c = *++s) >= 'A' && c <= 'Z')
			c += 'a' - 'A';
		if (c != d)
			return 0;
		}
	*sp = s + 1;
	return 1;
	}